

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

double trng::math::ln_binomial(double n,double m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = ln_Gamma(1.83940392913873e-317);
  dVar2 = ln_Gamma(1.83941628077988e-317);
  dVar3 = ln_Gamma(1.83943999593088e-317);
  return (dVar1 - dVar2) - dVar3;
}

Assistant:

TRNG_CUDA_ENABLE
    inline double ln_binomial(double n, double m) {
      return ln_Gamma(n + 1) - ln_Gamma(m + 1) - ln_Gamma(n - m + 1);
    }